

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

BuiltIn __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateBuiltInDecoration
          (TGlslangToSpvTraverser *this,TBuiltInVariable builtIn,bool memberDeclaration)

{
  EShLanguage EVar1;
  uint uVar2;
  bool memberDeclaration_local;
  TBuiltInVariable builtIn_local;
  TGlslangToSpvTraverser *this_local;
  
  switch(builtIn) {
  case EbvNumWorkGroups:
    this_local._4_4_ = BuiltInNumWorkgroups;
    break;
  case EbvWorkGroupSize:
    this_local._4_4_ = BuiltInWorkgroupSize;
    break;
  case EbvWorkGroupId:
    this_local._4_4_ = BuiltInWorkgroupId;
    break;
  case EbvLocalInvocationId:
    this_local._4_4_ = BuiltInLocalInvocationId;
    break;
  case EbvGlobalInvocationId:
    this_local._4_4_ = BuiltInGlobalInvocationId;
    break;
  case EbvLocalInvocationIndex:
    this_local._4_4_ = BuiltInLocalInvocationIndex;
    break;
  case EbvNumSubgroups:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    this_local._4_4_ = BuiltInNumSubgroups;
    break;
  case EbvSubgroupID:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    this_local._4_4_ = BuiltInSubgroupId;
    break;
  case EbvSubGroupSize:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupSize;
    break;
  case EbvSubGroupInvocation:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupLocalInvocationId;
    break;
  case EbvSubGroupEqMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupEqMask;
    break;
  case EbvSubGroupGeMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupGeMask;
    break;
  case EbvSubGroupGtMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupGtMask;
    break;
  case EbvSubGroupLeMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupLeMask;
    break;
  case EbvSubGroupLtMask:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
    this_local._4_4_ = BuiltInSubgroupLtMask;
    break;
  case EbvSubgroupSize2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    this_local._4_4_ = BuiltInSubgroupSize;
    break;
  case EbvSubgroupInvocation2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    this_local._4_4_ = BuiltInSubgroupLocalInvocationId;
    break;
  case EbvSubgroupEqMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    this_local._4_4_ = BuiltInSubgroupEqMask;
    break;
  case EbvSubgroupGeMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    this_local._4_4_ = BuiltInSubgroupGeMask;
    break;
  case EbvSubgroupGtMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    this_local._4_4_ = BuiltInSubgroupGtMask;
    break;
  case EbvSubgroupLeMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    this_local._4_4_ = BuiltInSubgroupLeMask;
    break;
  case EbvSubgroupLtMask2:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    this_local._4_4_ = BuiltInSubgroupLtMask;
    break;
  case EbvVertexId:
    this_local._4_4_ = BuiltInVertexId;
    break;
  case EbvInstanceId:
    this_local._4_4_ = BuiltInInstanceId;
    break;
  case EbvVertexIndex:
    this_local._4_4_ = BuiltInVertexIndex;
    break;
  case EbvInstanceIndex:
    this_local._4_4_ = BuiltInInstanceIndex;
    break;
  case EbvBaseVertex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    this_local._4_4_ = BaseVertex;
    break;
  case EbvBaseInstance:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    this_local._4_4_ = BaseInstance;
    break;
  case EbvDrawId:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_shader_draw_parameters",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDrawParameters);
    this_local._4_4_ = BuiltInDrawIndex;
    break;
  case EbvPosition:
    this_local._4_4_ = BuiltInPosition;
    break;
  case EbvPointSize:
    if (!memberDeclaration) {
      EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (EVar1 - EShLangTessControl < 2) {
        spv::Builder::addCapability(&this->builder,CapabilityTessellationPointSize);
      }
      else if (EVar1 == EShLangGeometry) {
        spv::Builder::addCapability(&this->builder,CapabilityGeometryPointSize);
      }
    }
    this_local._4_4_ = BuiltInPointSize;
    break;
  default:
    this_local._4_4_ = BuiltInMax;
    break;
  case EbvClipDistance:
    if (!memberDeclaration) {
      spv::Builder::addCapability(&this->builder,CapabilityClipDistance);
    }
    this_local._4_4_ = BuiltInClipDistance;
    break;
  case EbvCullDistance:
    if (!memberDeclaration) {
      spv::Builder::addCapability(&this->builder,CapabilityCullDistance);
    }
    this_local._4_4_ = BuiltInCullDistance;
    break;
  case EbvInvocationId:
    this_local._4_4_ = BuiltInInvocationId;
    break;
  case EbvPrimitiveId:
    EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if (EVar1 == EShLangFragment) {
      spv::Builder::addCapability(&this->builder,CapabilityGeometry);
    }
    this_local._4_4_ = BuiltInPrimitiveId;
    break;
  case EbvLayer:
    EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if (EVar1 == EShLangMesh) {
      this_local._4_4_ = BuiltInLayer;
    }
    else {
      EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if ((EVar1 == EShLangGeometry) ||
         (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
         EVar1 == EShLangFragment)) {
        spv::Builder::addCapability(&this->builder,CapabilityGeometry);
      }
      EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (((EVar1 == EShLangVertex) ||
          (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
          EVar1 == EShLangTessControl)) ||
         (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
         EVar1 == EShLangTessEvaluation)) {
        uVar2 = spv::Builder::getSpvVersion(&this->builder);
        if (uVar2 < 0x10500) {
          spv::Builder::addIncorporatedExtension
                    (&this->builder,"SPV_EXT_shader_viewport_index_layer",Spv_1_5);
          spv::Builder::addCapability(&this->builder,CapabilityShaderViewportIndexLayerEXT);
        }
        else {
          spv::Builder::addCapability(&this->builder,CapabilityShaderLayer);
        }
      }
      this_local._4_4_ = BuiltInLayer;
    }
    break;
  case EbvViewportIndex:
    EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if ((EVar1 == EShLangGeometry) ||
       (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
       EVar1 == EShLangFragment)) {
      spv::Builder::addCapability(&this->builder,CapabilityMultiViewport);
    }
    EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if (((EVar1 == EShLangVertex) ||
        (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
        EVar1 == EShLangTessControl)) ||
       (EVar1 = glslang::TIntermediate::getStage(this->glslangIntermediate),
       EVar1 == EShLangTessEvaluation)) {
      uVar2 = spv::Builder::getSpvVersion(&this->builder);
      if (uVar2 < 0x10500) {
        spv::Builder::addIncorporatedExtension
                  (&this->builder,"SPV_EXT_shader_viewport_index_layer",Spv_1_5);
        spv::Builder::addCapability(&this->builder,CapabilityShaderViewportIndexLayerEXT);
      }
      else {
        spv::Builder::addCapability(&this->builder,CapabilityShaderViewportIndex);
      }
    }
    this_local._4_4_ = BuiltInViewportIndex;
    break;
  case EbvPatchVertices:
    this_local._4_4_ = BuiltInPatchVertices;
    break;
  case EbvTessLevelOuter:
    this_local._4_4_ = BuiltInTessLevelOuter;
    break;
  case EbvTessLevelInner:
    this_local._4_4_ = BuiltInTessLevelInner;
    break;
  case EbvTessCoord:
    this_local._4_4_ = BuiltInTessCoord;
    break;
  case EbvFace:
    this_local._4_4_ = BuiltInFrontFacing;
    break;
  case EbvFragCoord:
    this_local._4_4_ = BuiltInFragCoord;
    break;
  case EbvPointCoord:
    this_local._4_4_ = BuiltInPointCoord;
    break;
  case EbvFragDepth:
    this_local._4_4_ = BuiltInFragDepth;
    break;
  case EbvFragStencilRef:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_stencil_export");
    spv::Builder::addCapability(&this->builder,CapabilityStencilExportEXT);
    this_local._4_4_ = BuiltInFragStencilRefEXT;
    break;
  case EbvSampleId:
    spv::Builder::addCapability(&this->builder,CapabilitySampleRateShading);
    this_local._4_4_ = BuiltInSampleId;
    break;
  case EbvSamplePosition:
    spv::Builder::addCapability(&this->builder,CapabilitySampleRateShading);
    this_local._4_4_ = BuiltInSamplePosition;
    break;
  case EbvSampleMask:
    this_local._4_4_ = BuiltInSampleMask;
    break;
  case EbvHelperInvocation:
    this_local._4_4_ = BuiltInHelperInvocation;
    break;
  case EbvBaryCoordNoPersp:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordNoPerspAMD;
    break;
  case EbvBaryCoordNoPerspCentroid:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordNoPerspCentroidAMD;
    break;
  case EbvBaryCoordNoPerspSample:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordNoPerspSampleAMD;
    break;
  case EbvBaryCoordSmooth:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordSmoothAMD;
    break;
  case EbvBaryCoordSmoothCentroid:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordSmoothCentroidAMD;
    break;
  case EbvBaryCoordSmoothSample:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordSmoothSampleAMD;
    break;
  case EbvBaryCoordPullModel:
    spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
    this_local._4_4_ = BaryCoordPullModelAMD;
    break;
  case EbvViewIndex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_multiview",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityMultiView);
    this_local._4_4_ = BuiltInViewIndex;
    break;
  case EbvDeviceIndex:
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_KHR_device_group",Spv_1_3);
    spv::Builder::addCapability(&this->builder,CapabilityDeviceGroup);
    this_local._4_4_ = BuiltInDeviceIndex;
    break;
  case EbvShadingRateKHR:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentShadingRateKHR);
    this_local._4_4_ = BuiltInShadingRateKHR;
    break;
  case EbvPrimitiveShadingRateKHR:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentShadingRateKHR);
    this_local._4_4_ = BuiltInPrimitiveShadingRateKHR;
    break;
  case EbvFragSizeEXT:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_fragment_invocation_density");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    this_local._4_4_ = BuiltInFragSizeEXT;
    break;
  case EbvFragInvocationCountEXT:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_fragment_invocation_density");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    this_local._4_4_ = BuiltInFragInvocationCountEXT;
    break;
  case EbvViewportMaskNV:
    if (!memberDeclaration) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_viewport_array2");
      spv::Builder::addCapability(&this->builder,CapabilityShaderViewportMaskNV);
    }
    this_local._4_4_ = BuiltInViewportMaskNV;
    break;
  case EbvSecondaryPositionNV:
    if (!memberDeclaration) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_stereo_view_rendering");
      spv::Builder::addCapability(&this->builder,CapabilityShaderStereoViewNV);
    }
    this_local._4_4_ = BuiltInSecondaryPositionNV;
    break;
  case EbvSecondaryViewportMaskNV:
    if (!memberDeclaration) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_stereo_view_rendering");
      spv::Builder::addCapability(&this->builder,CapabilityShaderStereoViewNV);
    }
    this_local._4_4_ = BuiltInSecondaryViewportMaskNV;
    break;
  case EbvPositionPerViewNV:
    if (!memberDeclaration) {
      spv::Builder::addExtension(&this->builder,"SPV_NVX_multiview_per_view_attributes");
      spv::Builder::addCapability(&this->builder,CapabilityPerViewAttributesNV);
    }
    this_local._4_4_ = BuiltInPositionPerViewNV;
    break;
  case EbvViewportMaskPerViewNV:
    if (!memberDeclaration) {
      spv::Builder::addExtension(&this->builder,"SPV_NVX_multiview_per_view_attributes");
      spv::Builder::addCapability(&this->builder,CapabilityPerViewAttributesNV);
    }
    this_local._4_4_ = BuiltInViewportMaskPerViewNV;
    break;
  case EbvFragFullyCoveredNV:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_fragment_fully_covered");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentFullyCoveredEXT);
    this_local._4_4_ = BuiltInFullyCoveredEXT;
    break;
  case EbvFragmentSizeNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    this_local._4_4_ = BuiltInFragSizeEXT;
    break;
  case EbvInvocationsPerPixelNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shading_rate");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentDensityEXT);
    this_local._4_4_ = BuiltInFragInvocationCountEXT;
    break;
  case EbvLaunchId:
    this_local._4_4_ = BuiltInLaunchIdKHR;
    break;
  case EbvLaunchSize:
    this_local._4_4_ = BuiltInLaunchSizeKHR;
    break;
  case EbvInstanceCustomIndex:
    this_local._4_4_ = BuiltInInstanceCustomIndexKHR;
    break;
  case EbvGeometryIndex:
    this_local._4_4_ = BuiltInRayGeometryIndexKHR;
    break;
  case EbvWorldRayOrigin:
    this_local._4_4_ = BuiltInWorldRayOriginKHR;
    break;
  case EbvWorldRayDirection:
    this_local._4_4_ = BuiltInWorldRayDirectionKHR;
    break;
  case EbvObjectRayOrigin:
    this_local._4_4_ = BuiltInObjectRayOriginKHR;
    break;
  case EbvObjectRayDirection:
    this_local._4_4_ = BuiltInObjectRayDirectionKHR;
    break;
  case EbvRayTmin:
    this_local._4_4_ = BuiltInRayTminKHR;
    break;
  case EbvRayTmax:
    this_local._4_4_ = BuiltInRayTmaxKHR;
    break;
  case EbvCullMask:
    this_local._4_4_ = BuiltInCullMaskKHR;
    break;
  case EbvHitKind:
    this_local._4_4_ = BuiltInHitKindKHR;
    break;
  case EbvObjectToWorld:
  case EbvObjectToWorld3x4:
    this_local._4_4_ = BuiltInObjectToWorldKHR;
    break;
  case EbvWorldToObject:
  case EbvWorldToObject3x4:
    this_local._4_4_ = BuiltInWorldToObjectKHR;
    break;
  case EbvIncomingRayFlags:
    this_local._4_4_ = BuiltInIncomingRayFlagsKHR;
    break;
  case EbvCurrentRayTimeNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_ray_tracing_motion_blur");
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingMotionBlurNV);
    this_local._4_4_ = BuiltInCurrentRayTimeNV;
    break;
  case EbvClusterIDNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingClusterAccelerationStructureNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cluster_acceleration_structure");
    this_local._4_4_ = BuiltInClusterIDNV;
    break;
  case EbvBaryCoordNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_fragment_shader_barycentric");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    this_local._4_4_ = BaryCoordKHR;
    break;
  case EbvBaryCoordNoPerspNV:
    spv::Builder::addExtension(&this->builder,"SPV_NV_fragment_shader_barycentric");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    this_local._4_4_ = BaryCoordNoPerspKHR;
    break;
  case EbvBaryCoordEXT:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shader_barycentric");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    this_local._4_4_ = BaryCoordKHR;
    break;
  case EbvBaryCoordNoPerspEXT:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shader_barycentric");
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    this_local._4_4_ = BaryCoordNoPerspKHR;
    break;
  case EbvTaskCountNV:
    this_local._4_4_ = BuiltInTaskCountNV;
    break;
  case EbvPrimitiveCountNV:
    this_local._4_4_ = BuiltInPrimitiveCountNV;
    break;
  case EbvPrimitiveIndicesNV:
    this_local._4_4_ = BuiltInPrimitiveIndicesNV;
    break;
  case EbvClipDistancePerViewNV:
    this_local._4_4_ = BuiltInClipDistancePerViewNV;
    break;
  case EbvCullDistancePerViewNV:
    this_local._4_4_ = BuiltInCullDistancePerViewNV;
    break;
  case EbvLayerPerViewNV:
    this_local._4_4_ = BuiltInLayerPerViewNV;
    break;
  case EbvMeshViewCountNV:
    this_local._4_4_ = BuiltInMeshViewCountNV;
    break;
  case EbvMeshViewIndicesNV:
    this_local._4_4_ = BuiltInMeshViewIndicesNV;
    break;
  case EbvMicroTrianglePositionNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    this_local._4_4_ = BuiltInHitMicroTriangleVertexPositionsNV;
    break;
  case EbvMicroTriangleBaryNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    this_local._4_4_ = BuiltInHitMicroTriangleVertexBarycentricsNV;
    break;
  case EbvHitKindFrontFacingMicroTriangleNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    this_local._4_4_ = BuiltInHitKindFrontFacingMicroTriangleNV;
    break;
  case EbvHitKindBackFacingMicroTriangleNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingDisplacementMicromapNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_displacement_micromap");
    this_local._4_4_ = BuiltInHitKindBackFacingMicroTriangleNV;
    break;
  case EbvHitIsSphereNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitIsSphereNV;
    break;
  case EbvHitIsLSSNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitIsLSSNV;
    break;
  case EbvHitSpherePositionNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitSpherePositionNV;
    break;
  case EbvHitSphereRadiusNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitSphereRadiusNV;
    break;
  case EbvHitLSSPositionsNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitLSSPositionsNV;
    break;
  case EbvHitLSSRadiiNV:
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingLinearSweptSpheresGeometryNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_linear_swept_spheres");
    this_local._4_4_ = BuiltInHitLSSRadiiNV;
    break;
  case EbvPrimitivePointIndicesEXT:
    this_local._4_4_ = BuiltInPrimitivePointIndicesEXT;
    break;
  case EbvPrimitiveLineIndicesEXT:
    this_local._4_4_ = BuiltInPrimitiveLineIndicesEXT;
    break;
  case EbvPrimitiveTriangleIndicesEXT:
    this_local._4_4_ = BuiltInPrimitiveTriangleIndicesEXT;
    break;
  case EbvCullPrimitiveEXT:
    this_local._4_4_ = BuiltInCullPrimitiveEXT;
    break;
  case EbvWarpsPerSM:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    this_local._4_4_ = BuiltInWarpsPerSMNV;
    break;
  case EbvSMCount:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    this_local._4_4_ = BuiltInSMCountNV;
    break;
  case EbvWarpID:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    this_local._4_4_ = BuiltInWarpIDNV;
    break;
  case EbvSMID:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_sm_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityShaderSMBuiltinsNV);
    this_local._4_4_ = BuiltInSMIDNV;
    break;
  case EbvCoreCountARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    this_local._4_4_ = BuiltInCoreCountARM;
    break;
  case EbvCoreIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    this_local._4_4_ = BuiltInCoreIDARM;
    break;
  case EbvCoreMaxIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    this_local._4_4_ = BuiltInCoreMaxIDARM;
    break;
  case EbvWarpIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    this_local._4_4_ = BuiltInWarpIDARM;
    break;
  case EbvWarpMaxIDARM:
    spv::Builder::addExtension(&this->builder,"SPV_ARM_core_builtins");
    spv::Builder::addCapability(&this->builder,CapabilityCoreBuiltinsARM);
    this_local._4_4_ = BuiltInWarpMaxIDARM;
    break;
  case EbvPositionFetch:
    this_local._4_4_ = BuiltInHitTriangleVertexPositionsKHR;
  }
  return this_local._4_4_;
}

Assistant:

spv::BuiltIn TGlslangToSpvTraverser::TranslateBuiltInDecoration(glslang::TBuiltInVariable builtIn,
    bool memberDeclaration)
{
    switch (builtIn) {
    case glslang::EbvPointSize:
        // Defer adding the capability until the built-in is actually used.
        if (! memberDeclaration) {
            switch (glslangIntermediate->getStage()) {
            case EShLangGeometry:
                builder.addCapability(spv::CapabilityGeometryPointSize);
                break;
            case EShLangTessControl:
            case EShLangTessEvaluation:
                builder.addCapability(spv::CapabilityTessellationPointSize);
                break;
            default:
                break;
            }
        }
        return spv::BuiltInPointSize;

    case glslang::EbvPosition:             return spv::BuiltInPosition;
    case glslang::EbvVertexId:             return spv::BuiltInVertexId;
    case glslang::EbvInstanceId:           return spv::BuiltInInstanceId;
    case glslang::EbvVertexIndex:          return spv::BuiltInVertexIndex;
    case glslang::EbvInstanceIndex:        return spv::BuiltInInstanceIndex;

    case glslang::EbvFragCoord:            return spv::BuiltInFragCoord;
    case glslang::EbvPointCoord:           return spv::BuiltInPointCoord;
    case glslang::EbvFace:                 return spv::BuiltInFrontFacing;
    case glslang::EbvFragDepth:            return spv::BuiltInFragDepth;

    case glslang::EbvNumWorkGroups:        return spv::BuiltInNumWorkgroups;
    case glslang::EbvWorkGroupSize:        return spv::BuiltInWorkgroupSize;
    case glslang::EbvWorkGroupId:          return spv::BuiltInWorkgroupId;
    case glslang::EbvLocalInvocationId:    return spv::BuiltInLocalInvocationId;
    case glslang::EbvLocalInvocationIndex: return spv::BuiltInLocalInvocationIndex;
    case glslang::EbvGlobalInvocationId:   return spv::BuiltInGlobalInvocationId;

    // These *Distance capabilities logically belong here, but if the member is declared and
    // then never used, consumers of SPIR-V prefer the capability not be declared.
    // They are now generated when used, rather than here when declared.
    // Potentially, the specification should be more clear what the minimum
    // use needed is to trigger the capability.
    //
    case glslang::EbvClipDistance:
        if (!memberDeclaration)
            builder.addCapability(spv::CapabilityClipDistance);
        return spv::BuiltInClipDistance;

    case glslang::EbvCullDistance:
        if (!memberDeclaration)
            builder.addCapability(spv::CapabilityCullDistance);
        return spv::BuiltInCullDistance;

    case glslang::EbvViewportIndex:
        if (glslangIntermediate->getStage() == EShLangGeometry ||
            glslangIntermediate->getStage() == EShLangFragment) {
            builder.addCapability(spv::CapabilityMultiViewport);
        }
        if (glslangIntermediate->getStage() == EShLangVertex ||
            glslangIntermediate->getStage() == EShLangTessControl ||
            glslangIntermediate->getStage() == EShLangTessEvaluation) {

            if (builder.getSpvVersion() < spv::Spv_1_5) {
                builder.addIncorporatedExtension(spv::E_SPV_EXT_shader_viewport_index_layer, spv::Spv_1_5);
                builder.addCapability(spv::CapabilityShaderViewportIndexLayerEXT);
            }
            else
                builder.addCapability(spv::CapabilityShaderViewportIndex);
        }
        return spv::BuiltInViewportIndex;

    case glslang::EbvSampleId:
        builder.addCapability(spv::CapabilitySampleRateShading);
        return spv::BuiltInSampleId;

    case glslang::EbvSamplePosition:
        builder.addCapability(spv::CapabilitySampleRateShading);
        return spv::BuiltInSamplePosition;

    case glslang::EbvSampleMask:
        return spv::BuiltInSampleMask;

    case glslang::EbvLayer:
        if (glslangIntermediate->getStage() == EShLangMesh) {
            return spv::BuiltInLayer;
        }
        if (glslangIntermediate->getStage() == EShLangGeometry ||
            glslangIntermediate->getStage() == EShLangFragment) {
            builder.addCapability(spv::CapabilityGeometry);
        }
        if (glslangIntermediate->getStage() == EShLangVertex ||
            glslangIntermediate->getStage() == EShLangTessControl ||
            glslangIntermediate->getStage() == EShLangTessEvaluation) {

            if (builder.getSpvVersion() < spv::Spv_1_5) {
                builder.addIncorporatedExtension(spv::E_SPV_EXT_shader_viewport_index_layer, spv::Spv_1_5);
                builder.addCapability(spv::CapabilityShaderViewportIndexLayerEXT);
            } else
                builder.addCapability(spv::CapabilityShaderLayer);
        }
        return spv::BuiltInLayer;

    case glslang::EbvBaseVertex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInBaseVertex;

    case glslang::EbvBaseInstance:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInBaseInstance;

    case glslang::EbvDrawId:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_shader_draw_parameters, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDrawParameters);
        return spv::BuiltInDrawIndex;

    case glslang::EbvPrimitiveId:
        if (glslangIntermediate->getStage() == EShLangFragment)
            builder.addCapability(spv::CapabilityGeometry);
        return spv::BuiltInPrimitiveId;

    case glslang::EbvFragStencilRef:
        builder.addExtension(spv::E_SPV_EXT_shader_stencil_export);
        builder.addCapability(spv::CapabilityStencilExportEXT);
        return spv::BuiltInFragStencilRefEXT;

    case glslang::EbvShadingRateKHR:
        builder.addExtension(spv::E_SPV_KHR_fragment_shading_rate);
        builder.addCapability(spv::CapabilityFragmentShadingRateKHR);
        return spv::BuiltInShadingRateKHR;

    case glslang::EbvPrimitiveShadingRateKHR:
        builder.addExtension(spv::E_SPV_KHR_fragment_shading_rate);
        builder.addCapability(spv::CapabilityFragmentShadingRateKHR);
        return spv::BuiltInPrimitiveShadingRateKHR;

    case glslang::EbvInvocationId:         return spv::BuiltInInvocationId;
    case glslang::EbvTessLevelInner:       return spv::BuiltInTessLevelInner;
    case glslang::EbvTessLevelOuter:       return spv::BuiltInTessLevelOuter;
    case glslang::EbvTessCoord:            return spv::BuiltInTessCoord;
    case glslang::EbvPatchVertices:        return spv::BuiltInPatchVertices;
    case glslang::EbvHelperInvocation:     return spv::BuiltInHelperInvocation;

    case glslang::EbvSubGroupSize:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupSize;

    case glslang::EbvSubGroupInvocation:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLocalInvocationId;

    case glslang::EbvSubGroupEqMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupEqMask;

    case glslang::EbvSubGroupGeMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupGeMask;

    case glslang::EbvSubGroupGtMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupGtMask;

    case glslang::EbvSubGroupLeMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLeMask;

    case glslang::EbvSubGroupLtMask:
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
        return spv::BuiltInSubgroupLtMask;

    case glslang::EbvNumSubgroups:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInNumSubgroups;

    case glslang::EbvSubgroupID:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupId;

    case glslang::EbvSubgroupSize2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupSize;

    case glslang::EbvSubgroupInvocation2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        return spv::BuiltInSubgroupLocalInvocationId;

    case glslang::EbvSubgroupEqMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupEqMask;

    case glslang::EbvSubgroupGeMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupGeMask;

    case glslang::EbvSubgroupGtMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupGtMask;

    case glslang::EbvSubgroupLeMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupLeMask;

    case glslang::EbvSubgroupLtMask2:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        return spv::BuiltInSubgroupLtMask;

    case glslang::EbvBaryCoordNoPersp:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspAMD;

    case glslang::EbvBaryCoordNoPerspCentroid:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspCentroidAMD;

    case glslang::EbvBaryCoordNoPerspSample:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordNoPerspSampleAMD;

    case glslang::EbvBaryCoordSmooth:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothAMD;

    case glslang::EbvBaryCoordSmoothCentroid:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothCentroidAMD;

    case glslang::EbvBaryCoordSmoothSample:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordSmoothSampleAMD;

    case glslang::EbvBaryCoordPullModel:
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::BuiltInBaryCoordPullModelAMD;

    case glslang::EbvDeviceIndex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_device_group, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityDeviceGroup);
        return spv::BuiltInDeviceIndex;

    case glslang::EbvViewIndex:
        builder.addIncorporatedExtension(spv::E_SPV_KHR_multiview, spv::Spv_1_3);
        builder.addCapability(spv::CapabilityMultiView);
        return spv::BuiltInViewIndex;

    case glslang::EbvFragSizeEXT:
        builder.addExtension(spv::E_SPV_EXT_fragment_invocation_density);
        builder.addCapability(spv::CapabilityFragmentDensityEXT);
        return spv::BuiltInFragSizeEXT;

    case glslang::EbvFragInvocationCountEXT:
        builder.addExtension(spv::E_SPV_EXT_fragment_invocation_density);
        builder.addCapability(spv::CapabilityFragmentDensityEXT);
        return spv::BuiltInFragInvocationCountEXT;

    case glslang::EbvViewportMaskNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_viewport_array2);
            builder.addCapability(spv::CapabilityShaderViewportMaskNV);
        }
        return spv::BuiltInViewportMaskNV;
    case glslang::EbvSecondaryPositionNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
        }
        return spv::BuiltInSecondaryPositionNV;
    case glslang::EbvSecondaryViewportMaskNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
        }
        return spv::BuiltInSecondaryViewportMaskNV;
    case glslang::EbvPositionPerViewNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NVX_multiview_per_view_attributes);
            builder.addCapability(spv::CapabilityPerViewAttributesNV);
        }
        return spv::BuiltInPositionPerViewNV;
    case glslang::EbvViewportMaskPerViewNV:
        if (!memberDeclaration) {
            builder.addExtension(spv::E_SPV_NVX_multiview_per_view_attributes);
            builder.addCapability(spv::CapabilityPerViewAttributesNV);
        }
        return spv::BuiltInViewportMaskPerViewNV;
    case glslang::EbvFragFullyCoveredNV:
        builder.addExtension(spv::E_SPV_EXT_fragment_fully_covered);
        builder.addCapability(spv::CapabilityFragmentFullyCoveredEXT);
        return spv::BuiltInFullyCoveredEXT;
    case glslang::EbvFragmentSizeNV:
        builder.addExtension(spv::E_SPV_NV_shading_rate);
        builder.addCapability(spv::CapabilityShadingRateNV);
        return spv::BuiltInFragmentSizeNV;
    case glslang::EbvInvocationsPerPixelNV:
        builder.addExtension(spv::E_SPV_NV_shading_rate);
        builder.addCapability(spv::CapabilityShadingRateNV);
        return spv::BuiltInInvocationsPerPixelNV;

    // ray tracing
    case glslang::EbvLaunchId:
        return spv::BuiltInLaunchIdKHR;
    case glslang::EbvLaunchSize:
        return spv::BuiltInLaunchSizeKHR;
    case glslang::EbvWorldRayOrigin:
        return spv::BuiltInWorldRayOriginKHR;
    case glslang::EbvWorldRayDirection:
        return spv::BuiltInWorldRayDirectionKHR;
    case glslang::EbvObjectRayOrigin:
        return spv::BuiltInObjectRayOriginKHR;
    case glslang::EbvObjectRayDirection:
        return spv::BuiltInObjectRayDirectionKHR;
    case glslang::EbvRayTmin:
        return spv::BuiltInRayTminKHR;
    case glslang::EbvRayTmax:
        return spv::BuiltInRayTmaxKHR;
    case glslang::EbvCullMask:
        return spv::BuiltInCullMaskKHR;
    case glslang::EbvPositionFetch:
        return spv::BuiltInHitTriangleVertexPositionsKHR;
    case glslang::EbvInstanceCustomIndex:
        return spv::BuiltInInstanceCustomIndexKHR;
    case glslang::EbvHitKind:
        return spv::BuiltInHitKindKHR;
    case glslang::EbvObjectToWorld:
    case glslang::EbvObjectToWorld3x4:
        return spv::BuiltInObjectToWorldKHR;
    case glslang::EbvWorldToObject:
    case glslang::EbvWorldToObject3x4:
        return spv::BuiltInWorldToObjectKHR;
    case glslang::EbvIncomingRayFlags:
        return spv::BuiltInIncomingRayFlagsKHR;
    case glslang::EbvGeometryIndex:
        return spv::BuiltInRayGeometryIndexKHR;
    case glslang::EbvCurrentRayTimeNV:
        builder.addExtension(spv::E_SPV_NV_ray_tracing_motion_blur);
        builder.addCapability(spv::CapabilityRayTracingMotionBlurNV);
        return spv::BuiltInCurrentRayTimeNV;
    case glslang::EbvMicroTrianglePositionNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitMicroTriangleVertexPositionsNV;
    case glslang::EbvMicroTriangleBaryNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitMicroTriangleVertexBarycentricsNV;
    case glslang::EbvHitKindFrontFacingMicroTriangleNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitKindFrontFacingMicroTriangleNV;
    case glslang::EbvHitKindBackFacingMicroTriangleNV:
        builder.addCapability(spv::CapabilityRayTracingDisplacementMicromapNV);
        builder.addExtension("SPV_NV_displacement_micromap");
        return spv::BuiltInHitKindBackFacingMicroTriangleNV;
    case glslang::EbvClusterIDNV:
        builder.addCapability(spv::CapabilityRayTracingClusterAccelerationStructureNV);
        builder.addExtension("SPV_NV_cluster_acceleration_structure");
        return spv::BuiltInClusterIDNV;
    case glslang::EbvHitIsSphereNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitIsSphereNV;
    case glslang::EbvHitIsLSSNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitIsLSSNV;
    case glslang::EbvHitSpherePositionNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitSpherePositionNV;
    case glslang::EbvHitSphereRadiusNV:
        builder.addCapability(spv::CapabilityRayTracingSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitSphereRadiusNV;
    case glslang::EbvHitLSSPositionsNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitLSSPositionsNV;
    case glslang::EbvHitLSSRadiiNV:
        builder.addCapability(spv::CapabilityRayTracingLinearSweptSpheresGeometryNV);
        builder.addExtension("SPV_NV_linear_swept_spheres");
        return spv::BuiltInHitLSSRadiiNV;

    // barycentrics
    case glslang::EbvBaryCoordNV:
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        return spv::BuiltInBaryCoordNV;
    case glslang::EbvBaryCoordNoPerspNV:
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        return spv::BuiltInBaryCoordNoPerspNV;

    case glslang::EbvBaryCoordEXT:
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        return spv::BuiltInBaryCoordKHR;
    case glslang::EbvBaryCoordNoPerspEXT:
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        return spv::BuiltInBaryCoordNoPerspKHR;

    // mesh shaders
    case glslang::EbvTaskCountNV:
        return spv::BuiltInTaskCountNV;
    case glslang::EbvPrimitiveCountNV:
        return spv::BuiltInPrimitiveCountNV;
    case glslang::EbvPrimitiveIndicesNV:
        return spv::BuiltInPrimitiveIndicesNV;
    case glslang::EbvClipDistancePerViewNV:
        return spv::BuiltInClipDistancePerViewNV;
    case glslang::EbvCullDistancePerViewNV:
        return spv::BuiltInCullDistancePerViewNV;
    case glslang::EbvLayerPerViewNV:
        return spv::BuiltInLayerPerViewNV;
    case glslang::EbvMeshViewCountNV:
        return spv::BuiltInMeshViewCountNV;
    case glslang::EbvMeshViewIndicesNV:
        return spv::BuiltInMeshViewIndicesNV;

    // SPV_EXT_mesh_shader
    case glslang::EbvPrimitivePointIndicesEXT:
        return spv::BuiltInPrimitivePointIndicesEXT;
    case glslang::EbvPrimitiveLineIndicesEXT:
        return spv::BuiltInPrimitiveLineIndicesEXT;
    case glslang::EbvPrimitiveTriangleIndicesEXT:
        return spv::BuiltInPrimitiveTriangleIndicesEXT;
    case glslang::EbvCullPrimitiveEXT:
        return spv::BuiltInCullPrimitiveEXT;

    // sm builtins
    case glslang::EbvWarpsPerSM:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInWarpsPerSMNV;
    case glslang::EbvSMCount:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInSMCountNV;
    case glslang::EbvWarpID:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInWarpIDNV;
    case glslang::EbvSMID:
        builder.addExtension(spv::E_SPV_NV_shader_sm_builtins);
        builder.addCapability(spv::CapabilityShaderSMBuiltinsNV);
        return spv::BuiltInSMIDNV;

   // ARM builtins
    case glslang::EbvCoreCountARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreCountARM;
    case glslang::EbvCoreIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreIDARM;
    case glslang::EbvCoreMaxIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInCoreMaxIDARM;
    case glslang::EbvWarpIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInWarpIDARM;
    case glslang::EbvWarpMaxIDARM:
        builder.addExtension(spv::E_SPV_ARM_core_builtins);
        builder.addCapability(spv::CapabilityCoreBuiltinsARM);
        return spv::BuiltInWarpMaxIDARM;

    default:
        return spv::BuiltInMax;
    }
}